

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O0

string * __thiscall
OpenSSLWrapper::SslConnection::GetSelAlpnProtocol_abi_cxx11_
          (string *__return_storage_ptr__,SslConnection *this)

{
  char *pcVar1;
  ulong uVar2;
  allocator local_25;
  uint local_24;
  char *pcStack_20;
  uint iProtoLen;
  uchar *cpAlpnProto;
  SslConnection *this_local;
  
  pcStack_20 = (char *)0x0;
  local_24 = 0;
  cpAlpnProto = (uchar *)this;
  this_local = (SslConnection *)__return_storage_ptr__;
  SSL_get0_alpn_selected(this->m_ssl,&stack0xffffffffffffffe0,&local_24);
  pcVar1 = pcStack_20;
  if ((pcStack_20 == (char *)0x0) || (local_24 == 0)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    uVar2 = (ulong)local_24;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,uVar2,&local_25);
    std::allocator<char>::~allocator((allocator<char> *)&local_25);
  }
  return __return_storage_ptr__;
}

Assistant:

string SslConnection::GetSelAlpnProtocol()
    {
        const unsigned char* cpAlpnProto = nullptr;
        unsigned int iProtoLen = 0;
        SSL_get0_alpn_selected(m_ssl, &cpAlpnProto, &iProtoLen);
        if (cpAlpnProto != nullptr && iProtoLen > 0)
            return string(reinterpret_cast<const char*>(cpAlpnProto), iProtoLen);

        return string();
    }